

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::PointLight::SampleLe
          (LightLeSample *__return_storage_ptr__,PointLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  SampledSpectrum SVar19;
  undefined1 auVar15 [56];
  undefined1 auVar18 [56];
  
  fVar1 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
  auVar16 = ZEXT816(0) << 0x40;
  auVar18 = ZEXT856(0);
  fVar9 = (u1->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar13 = vfmadd231ss_fma(auVar13,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar5 = auVar13._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]
                                            ));
  auVar13 = vfmadd231ss_fma(auVar13,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar6 = auVar13._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]
                                            ));
  auVar13 = vfmadd231ss_fma(auVar13,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar7 = auVar13._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  auVar13 = vfmadd231ss_fma(auVar13,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar8 = auVar13._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  fVar11 = cosf(fVar9);
  fVar12 = sinf(fVar9);
  fVar9 = this->scale;
  auVar13._4_4_ = fVar9;
  auVar13._0_4_ = fVar9;
  auVar13._8_4_ = fVar9;
  auVar13._12_4_ = fVar9;
  auVar15 = ZEXT856(auVar13._8_8_);
  uVar3 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  SVar19 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar17._0_8_ = SVar19.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar14._0_8_ = SVar19.values.values._0_8_;
  auVar14._8_56_ = auVar15;
  auVar16 = vmovlhps_avx(auVar14._0_16_,auVar17._0_16_);
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)fVar1),SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000))
  ;
  auVar13 = vfnmadd213ss_fma(auVar10,auVar10,SUB6416(ZEXT464(0x3f800000),0));
  auVar13 = vmaxss_avx(auVar13,ZEXT416(0));
  (__return_storage_ptr__->L).values.values[0] = auVar16._0_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[1] = auVar16._4_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[2] = auVar16._8_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[3] = auVar16._12_4_ * fVar9;
  bVar4 = fVar5 == 1.0;
  auVar13 = vsqrtss_avx(auVar13,auVar13);
  auVar13 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ * fVar11)),
                          ZEXT416((uint)(auVar13._0_4_ * fVar12)),0x10);
  auVar16 = vinsertps_avx(ZEXT416((uint)bVar4 * (int)fVar6 + (uint)!bVar4 * (int)(fVar6 / fVar5)),
                          ZEXT416((uint)bVar4 * (int)fVar7 + (uint)!bVar4 * (int)(fVar7 / fVar5)),
                          0x10);
  uVar2 = vmovlps_avx(auVar16);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar4 * (int)fVar8 + (uint)!bVar4 * (int)(fVar8 / fVar5));
  uVar2 = vmovlps_avx(auVar13);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar3;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample PointLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                   SampledWavelengths &lambda, Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}